

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

void __thiscall
TPZMatrix<std::complex<double>_>::Print
          (TPZMatrix<std::complex<double>_> *this,char *name,ostream *out,MatrixOutputFormat form)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  ostream *poVar4;
  long lVar5;
  int64_t col_4;
  long lVar6;
  char *pcVar7;
  TPZMatrix<std::complex<double>_> *pTVar8;
  int64_t col;
  int64_t col_2;
  long lVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  undefined8 extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  type_conflict1 val_00;
  double extraout_XMM0_Qa_04;
  double extraout_XMM1_Qa;
  double dVar13;
  double dVar14;
  type_conflict1 tVar15;
  complex<double> a;
  char *local_178;
  complex<double> val;
  ios cout_state;
  
  std::ios::ios((ios *)&cout_state,(streambuf *)0x0);
  std::ios::copyfmt(&cout_state);
  *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 8) = 0x11;
  if (EFixedColumn < form) goto LAB_00cf0c9d;
  lVar3 = (this->super_TPZBaseMatrix).fRow;
  lVar5 = (this->super_TPZBaseMatrix).fCol;
  switch(form) {
  case EFormatted:
    dVar13 = extraout_XMM1_Qa;
    std::operator<<(out,"Writing matrix \'");
    if (name != (char *)0x0) {
      std::operator<<(out,name);
    }
    poVar4 = std::operator<<(out,"\' (");
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
    poVar4 = std::operator<<(poVar4," x ");
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
    std::operator<<(poVar4,"):\n");
    lVar11 = 0;
    if (lVar5 < 1) {
      lVar5 = lVar11;
    }
    if (lVar3 < 1) {
      lVar3 = lVar11;
    }
    local_178 = "\n";
    for (; lVar11 != lVar3; lVar11 = lVar11 + 1) {
      std::operator<<(out,"\t");
      for (lVar6 = 0; lVar5 != lVar6; lVar6 = lVar6 + 1) {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar11,lVar6);
        val._M_value._0_8_ = extraout_XMM0_Qa;
        val._M_value._8_8_ = dVar13;
        poVar4 = std::operator<<(out,(complex *)&val);
        std::operator<<(poVar4,"  ");
      }
      std::operator<<(out,"\n");
    }
    goto LAB_00cf0930;
  case EInputFormat:
    dVar13 = extraout_XMM1_Qa;
    poVar4 = std::ostream::_M_insert<long>((long)out);
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
    std::endl<char,std::char_traits<char>>(poVar4);
    lVar11 = 0;
    if (lVar5 < 1) {
      lVar5 = lVar11;
    }
    if (lVar3 < 1) {
      lVar3 = lVar11;
    }
    local_178 = "-1 -1 0.\n";
    for (; lVar11 != lVar3; lVar11 = lVar11 + 1) {
      for (lVar6 = 0; lVar5 != lVar6; lVar6 = lVar6 + 1) {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar11,lVar6);
        val._M_value._0_8_ = extraout_XMM0_Qa_02;
        val._M_value._8_8_ = dVar13;
        if (((extraout_XMM0_Qa_02 != 0.0) || (NAN(extraout_XMM0_Qa_02))) ||
           ((dVar13 != 0.0 || (NAN(dVar13))))) {
          poVar4 = std::ostream::_M_insert<long>((long)out);
          poVar4 = std::operator<<(poVar4,' ');
          poVar4 = std::ostream::_M_insert<long>((long)poVar4);
          poVar4 = std::operator<<(poVar4,' ');
          poVar4 = std::operator<<(poVar4,(complex *)&val);
          std::endl<char,std::char_traits<char>>(poVar4);
        }
      }
    }
    goto LAB_00cf0930;
  case EMathematicaInput:
    dVar13 = extraout_XMM1_Qa;
    poVar4 = std::operator<<(out,name);
    std::operator<<(poVar4,"\n{ ");
    lVar6 = 0;
    lVar11 = lVar5;
    if (lVar5 < 1) {
      lVar11 = lVar6;
    }
    lVar9 = lVar3;
    if (lVar3 < 1) {
      lVar9 = lVar6;
    }
    for (; lVar6 != lVar9; lVar6 = lVar6 + 1) {
      std::operator<<(out,"\n{ ");
      uVar12 = 1;
      for (lVar10 = 0; lVar11 != lVar10; lVar10 = lVar10 + 1) {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar6,lVar10);
        dVar14 = dVar13;
        poVar4 = std::ostream::_M_insert<double>(extraout_XMM0_Qa_01);
        std::operator<<(poVar4,"+I");
        std::ostream::_M_insert<double>(dVar13);
        if (lVar10 < lVar5 + -1) {
          std::operator<<(out,", ");
        }
        dVar13 = dVar14;
        if ((uVar12 / 6) * 6 + -1 == lVar10) {
          std::operator<<(out,'\n');
          dVar13 = dVar14;
        }
        uVar12 = uVar12 + 1;
      }
      std::operator<<(out," }");
      if (lVar6 < lVar3 + -1) {
        std::operator<<(out,",");
      }
    }
    poVar4 = std::operator<<(out," };");
    std::endl<char,std::char_traits<char>>(poVar4);
    break;
  case EMatlabNonZeros:
    std::operator<<(out,name);
    lVar11 = 0;
    if (lVar5 < 1) {
      lVar5 = lVar11;
    }
    if (lVar3 < 1) {
      lVar3 = lVar11;
    }
    local_178 = "\n";
    for (; lVar11 != lVar3; lVar11 = lVar11 + 1) {
      std::operator<<(out,"\n|");
      for (lVar6 = 0; lVar5 != lVar6; lVar6 = lVar6 + 1) {
        lVar9 = lVar11;
        pTVar8 = this;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar11,lVar6);
        a._M_value._8_8_ = lVar9;
        a._M_value._0_8_ = pTVar8;
        bVar1 = IsZero(a);
        pcVar7 = ".";
        if (!bVar1) {
          pcVar7 = "#";
        }
        std::operator<<(out,pcVar7);
      }
      std::operator<<(out,"|");
    }
LAB_00cf0930:
    std::operator<<(out,local_178);
    break;
  case EMatrixMarket:
    dVar13 = extraout_XMM1_Qa;
    iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x10])(this);
    lVar5 = 0;
    if (0 < lVar3) {
      lVar5 = lVar3;
    }
    lVar11 = 0;
    while (lVar6 = lVar11, lVar6 != lVar5) {
      lVar9 = lVar6 + 1;
      if (iVar2 == 0) {
        lVar9 = lVar3;
      }
      if (lVar9 < 1) {
        lVar9 = 0;
      }
      for (lVar10 = 0; lVar11 = lVar6 + 1, lVar9 != lVar10; lVar10 = lVar10 + 1) {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar6,lVar10);
        dVar13 = (double)-(ulong)(dVar13 != 0.0 || extraout_XMM0_Qa_00 != 0.0);
      }
    }
    poVar4 = std::operator<<(out,"%%");
    poVar4 = std::operator<<(poVar4,name);
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::ostream::_M_insert<long>((long)out);
    poVar4 = std::operator<<(poVar4,' ');
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
    poVar4 = std::operator<<(poVar4,' ');
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
    std::endl<char,std::char_traits<char>>(poVar4);
    lVar11 = 0;
    while (lVar6 = lVar11, lVar6 != lVar5) {
      lVar9 = lVar6 + 1;
      if (iVar2 == 0) {
        lVar9 = lVar3;
      }
      if (lVar9 < 1) {
        lVar9 = 0;
      }
      lVar10 = 0;
      while (lVar11 = lVar6 + 1, lVar10 != lVar9) {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar6,lVar10);
        val._M_value._0_8_ = extraout_XMM0_Qa_04;
        val._M_value._8_8_ = dVar13;
        if ((((extraout_XMM0_Qa_04 != 0.0) || (NAN(extraout_XMM0_Qa_04))) || (dVar13 != 0.0)) ||
           (NAN(dVar13))) {
          poVar4 = std::ostream::_M_insert<long>((long)out);
          poVar4 = std::operator<<(poVar4,' ');
          lVar10 = lVar10 + 1;
          poVar4 = std::ostream::_M_insert<long>((long)poVar4);
          poVar4 = std::operator<<(poVar4,' ');
          poVar4 = std::operator<<(poVar4,(complex *)&val);
          std::operator<<(poVar4,'\n');
        }
        else {
          lVar10 = lVar10 + 1;
        }
      }
    }
    break;
  case ECSV:
    lVar6 = 0;
    lVar11 = lVar5;
    if (lVar5 < 1) {
      lVar11 = lVar6;
    }
    dVar13 = extraout_XMM1_Qa;
    lVar9 = lVar3;
    if (lVar3 < 1) {
      lVar9 = lVar6;
    }
    for (; lVar6 != lVar9; lVar6 = lVar6 + 1) {
      for (lVar10 = 0; lVar11 != lVar10; lVar10 = lVar10 + 1) {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar6,lVar10);
        dVar14 = dVar13;
        poVar4 = std::ostream::_M_insert<double>(extraout_XMM0_Qa_03);
        std::operator<<(poVar4,(dVar13 <= 0.0) * '\x02' + '+');
        poVar4 = std::ostream::_M_insert<double>(ABS(dVar13));
        std::operator<<(poVar4,"j");
        dVar13 = dVar14;
        if (lVar10 < lVar5 + -1) {
          std::operator<<(out," , ");
          dVar13 = dVar14;
        }
      }
      if (lVar6 < lVar3 + -1) {
        std::operator<<(out,"\n");
      }
    }
    break;
  case EFixedColumn:
    dVar13 = extraout_XMM1_Qa;
    std::operator<<(out,"Writing matrix \'");
    if (name != (char *)0x0) {
      std::operator<<(out,name);
    }
    poVar4 = std::operator<<(out,"\' (");
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
    poVar4 = std::operator<<(poVar4," x ");
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
    std::operator<<(poVar4,"):\n");
    lVar11 = 0;
    if (lVar5 < 1) {
      lVar5 = lVar11;
    }
    val._M_value._0_4_ = 0x11;
    if (lVar3 < 1) {
      lVar3 = lVar11;
    }
    for (; lVar11 != lVar3; lVar11 = lVar11 + 1) {
      for (lVar6 = 0; lVar5 != lVar6; lVar6 = lVar6 + 1) {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])(this,lVar11,lVar6);
        tVar15 = dVar13;
        std::operator<<(out,"(");
        Print::anon_class_4_1_2f8713ba::operator()((anon_class_4_1_2f8713ba *)&val,out,val_00);
        std::operator<<(out,",");
        Print::anon_class_4_1_2f8713ba::operator()((anon_class_4_1_2f8713ba *)&val,out,dVar13);
        dVar13 = tVar15;
        std::operator<<(out,")");
      }
      std::operator<<(out,"\n");
    }
    std::operator<<(out,"\n");
  }
LAB_00cf0c9d:
  std::ios::copyfmt((ios *)(out + *(long *)(*(long *)out + -0x18)));
  std::ios_base::~ios_base((ios_base *)&cout_state);
  return;
}

Assistant:

void TPZMatrix<TVar>::Print(const char *name, std::ostream& out,const MatrixOutputFormat form) const {
    if constexpr (std::is_same<TVar, TFad<6, REAL>>::value ||
                  std::is_same<TVar, Fad<float>>::value ||
                  std::is_same<TVar, Fad<double>>::value ||
                  std::is_same<TVar, Fad<long double>>::value) {
        out << name << std::endl;
        for (int64_t i = 0; i < fRow; i++) {
            for (int64_t j = 0; j < fCol; j++) {
                out << "i = " << i << " j = " << j << " val " << Get(i, j) << std::endl;
            }
        }
        return;
   
    }
    //getting current settings of std::ostream instance
    std::ios cout_state(nullptr);
    cout_state.copyfmt(out);

    typedef std::numeric_limits< RTVar > typlim;
    out << std::setprecision(typlim::max_digits10);

    const auto nrows = Rows();
    const auto ncols = Cols();
    
    if(form == EFormatted) {
        out << "Writing matrix '";
        if(name) out << name;
        out << "' (" << nrows << " x " << ncols << "):\n";
		
        for ( int64_t row = 0; row < nrows; row++) {
            out << "\t";
            for ( int64_t col = 0; col < ncols; col++ ) {
                out << GetVal( row, col) << "  ";//complex numbers are (a,b)
            }
            out << "\n";
        }
        out << "\n";
    } else if (form == EFixedColumn) {
        out << "Writing matrix '";
        if(name) out << name;
        out << "' (" << nrows << " x " << ncols << "):\n";
        TVar value;
        constexpr int columnlength = typlim::max_digits10;

        auto PrintVal = [columnlength](std::ostream &out, RTVar val){
            if(val<0.) {
                out << std::setw(columnlength+1) << std::left << val << " ";
            }else{
                out << " ";
                out << std::setw(columnlength)   << std::left << val << " ";
            }
        };
        
        for ( int64_t row = 0; row < nrows; row++) {
            for ( int64_t col = 0; col < ncols; col++ ) {
                value = Get( row, col);
                if constexpr (std::is_same_v<RTVar,TVar>){
                    PrintVal(out,value);
                }else{
                    out<<"(";
                    PrintVal(out,value.real());
                    out<<",";
                    PrintVal(out,value.imag());
                    out<<")";
                }
            }
            out << "\n";
        }
        out << "\n";
    } else if (form == EInputFormat) {
        out << nrows << " " << ncols << endl;
        for ( int64_t row = 0; row < nrows; row++) {
            for ( int64_t col = 0; col < ncols; col++ ) {
                const TVar val = GetVal(row, col);
                if(val != (TVar)0.) out << row << ' ' << col << ' ' << val << std::endl;
            }
        }
        out << "-1 -1 0.\n";
    } else if( form == EMathematicaInput)
        {
            
            out << name << "\n{ ";
            for ( int64_t row = 0; row < nrows; row++) {
                out << "\n{ ";
                for ( int64_t col = 0; col < ncols; col++ ) {
                    const TVar val = GetVal(row, col);
                    if constexpr (std::is_same_v<TVar,RTVar>){
                        out << val;
                    }else{
                        out << val.real() << "+I"<<val.imag();
                    }
                    if(col < ncols-1)
                        out << ", ";
                    if((col+1) % 6 == 0) out << '\n';
                }
                out << " }";
                if(row < nrows-1)
                    out << ",";
            }
		
            out << " };"<<std::endl;
		
        }else if( form == ECSV)
        {
         
            for ( int64_t row = 0; row < nrows; row++) {
                for ( int64_t col = 0; col < ncols; col++ ) {
                    const TVar val = GetVal(row, col);
                    if constexpr (std::is_same_v<TVar,RTVar>){
                        out << val;
                    }else{
                        const auto signchar = val.imag() > 0 ? '+' : '-';
                        out << val.real() <<signchar<<std::fabs(val.imag())<<"j";
                    }
                    if(col < ncols-1)  out << " , ";
                }
                if(row < nrows-1)
                    out << "\n";
            }

        } else if( form == EMatlabNonZeros)
        {
            out << name;
            for ( int64_t row = 0; row < nrows; row++) {
                out << "\n|";
                for ( int64_t col = 0; col < ncols; col++ )
                    if(IsZero(GetVal(row, col)) ){
                        out << ".";
                    }else{
                        out << "#";
                    }
                out << "|";
            }
            out << "\n";
        }
    else if( form == EMatrixMarket)
        {
            bool sym = IsSymmetric();
            int64_t numzero = 0;
            int64_t nrow = nrows;
            for ( int64_t row = 0; row < nrows; row++) {
                int64_t colmax = nrow;
                if (sym) colmax = row+1;
                for (int64_t col = 0; col < colmax; col++ )
                    {
                        TVar val = GetVal(row, col);
                        if (val != (TVar)0.) {
                            numzero++;
                        }
                    }
            }
            out << "%%"<< name << std::endl;
            out << nrows << ' ' << ncols << ' ' << numzero << std::endl;
            for ( int64_t row = 0; row < nrows; row++) {
                int64_t colmax = nrow;
                if (sym) colmax = row+1;
                for (int64_t col = 0; col < colmax; col++ )
                    {
                        const TVar val = GetVal(row, col);
                        if (val != (TVar)0.) {
                            out << row+1 << ' ' << col+1 << ' ' << val << '\n';
                        }
                    }
            }
        }
    //restore precision
    out.copyfmt(cout_state);
}